

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

bool __thiscall wallet::MockableBatch::ErasePrefix(MockableBatch *this,Span<const_std::byte> prefix)

{
  bool bVar1;
  long lVar2;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  *this_00;
  __normal_iterator<const_std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
  _Var3;
  _Base_ptr p_Var4;
  _Self __tmp;
  const_iterator __position;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = this->m_pass;
  if ((bVar1 == true) &&
     (__position._M_node = (this->m_records->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
     (_Rb_tree_header *)__position._M_node != &(this->m_records->_M_t)._M_impl.super__Rb_tree_header
     )) {
    do {
      if (((ulong)((long)__position._M_node[1]._M_parent - *(long *)(__position._M_node + 1)) <
           prefix.m_size) ||
         (_Var3 = std::
                  __search<__gnu_cxx::__normal_iterator<std::byte_const*,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,std::byte_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                            (*(long *)(__position._M_node + 1),__position._M_node[1]._M_parent,
                             prefix.m_data,prefix.m_data + prefix.m_size),
         _Var3._M_current != *(byte **)(__position._M_node + 1))) {
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      }
      else {
        this_00 = &this->m_records->_M_t;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        std::
        _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
        ::_M_erase_aux(this_00,__position);
      }
      __position._M_node = p_Var4;
    } while ((_Rb_tree_header *)p_Var4 != &(this->m_records->_M_t)._M_impl.super__Rb_tree_header);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool MockableBatch::ErasePrefix(Span<const std::byte> prefix)
{
    if (!m_pass) {
        return false;
    }
    auto it = m_records.begin();
    while (it != m_records.end()) {
        auto& key = it->first;
        if (key.size() < prefix.size() || std::search(key.begin(), key.end(), prefix.begin(), prefix.end()) != key.begin()) {
            it++;
            continue;
        }
        it = m_records.erase(it);
    }
    return true;
}